

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

ssize_t __thiscall
fmt::v6::internal::
arg_formatter_base<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>,_fmt::v6::internal::error_handler>
::write(arg_formatter_base<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>,_fmt::v6::internal::error_handler>
        *this,int __fd,void *__buf,size_t __n)

{
  basic_string_view<char> s;
  byte bVar1;
  ssize_t extraout_RAX;
  ssize_t sVar2;
  size_t __n_00;
  string_view sv;
  basic_string_view<char> *in_stack_ffffffffffffffc0;
  basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  *in_stack_ffffffffffffffe0;
  format_specs *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = (byte)__fd & 1;
  __n_00 = CONCAT71((int7)(__n >> 8),(byte)__fd) & 0xffffffffffffff01;
  basic_string_view<char>::basic_string_view(in_stack_ffffffffffffffc0,(char *)this);
  if (this->specs_ == (format_specs *)0x0) {
    sVar2 = basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
            ::write(&this->writer_,(int)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8,__n_00);
  }
  else {
    s.size_._0_7_ = in_stack_fffffffffffffff0;
    s.data_ = (char *)in_stack_ffffffffffffffe8;
    s.size_._7_1_ = bVar1;
    basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
    ::write<char>(in_stack_ffffffffffffffe0,s,in_stack_ffffffffffffffe8);
    sVar2 = extraout_RAX;
  }
  return sVar2;
}

Assistant:

void write(bool value) {
    string_view sv(value ? "true" : "false");
    specs_ ? writer_.write(sv, *specs_) : writer_.write(sv);
  }